

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall
QHttpNetworkRequest::prependHeaderField(QHttpNetworkRequest *this,QByteArray *name,QByteArray *data)

{
  QHttpNetworkRequestPrivate *this_00;
  
  this_00 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  QHttpNetworkHeaderPrivate::prependHeaderField(&this_00->super_QHttpNetworkHeaderPrivate,name,data)
  ;
  return;
}

Assistant:

void QHttpNetworkRequest::prependHeaderField(const QByteArray &name, const QByteArray &data)
{
    d->prependHeaderField(name, data);
}